

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O1

HalfEdge * __thiscall MeshLib::Vertex::most_clw_in_halfedge(Vertex *this)

{
  HalfEdge *pHVar1;
  
  if (this->m_boundary != false) {
    pHVar1 = this->m_halfedge;
    while( true ) {
      pHVar1 = HalfEdge::clw_rotate_about_target(pHVar1);
      if (pHVar1 == (HalfEdge *)0x0) break;
      this->m_halfedge = pHVar1;
    }
    return this->m_halfedge;
  }
  pHVar1 = most_ccw_in_halfedge(this);
  pHVar1 = HalfEdge::ccw_rotate_about_target(pHVar1);
  return pHVar1;
}

Assistant:

HalfEdge *  Vertex::most_clw_in_halfedge()  
{ 
	if( !m_boundary )
	{
		return most_ccw_in_halfedge()->ccw_rotate_about_target(); 
	}

	HalfEdge * he = m_halfedge->clw_rotate_about_target();
	
	while( he != NULL )
	{
		m_halfedge = he;
		he = m_halfedge->clw_rotate_about_target();
	}

	return m_halfedge;
}